

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
BinaryenArraySet(BinaryenModuleRef module,BinaryenExpressionRef ref,BinaryenExpressionRef index,
                BinaryenExpressionRef value)

{
  ArraySet *pAVar1;
  Builder local_10;
  
  local_10.wasm = module;
  pAVar1 = wasm::Builder::makeArraySet(&local_10,ref,index,value);
  return (BinaryenExpressionRef)pAVar1;
}

Assistant:

BinaryenExpressionRef BinaryenArraySet(BinaryenModuleRef module,
                                       BinaryenExpressionRef ref,
                                       BinaryenExpressionRef index,
                                       BinaryenExpressionRef value) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeArraySet((Expression*)ref, (Expression*)index, (Expression*)value));
}